

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O2

string * __thiscall
deqp::gls::fboc::details::AttachmentParams::getName_abi_cxx11_
          (string *__return_storage_ptr__,AttachmentParams *this,AttachmentParams *params)

{
  GLenum bufType;
  GLenum bufType_00;
  GLenum bufType_01;
  string sStack_138;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  attTypeName_abi_cxx11_(&local_38,(details *)(ulong)this->color0Kind,(GLenum)params);
  std::operator+(&local_d8,&local_38,"_");
  attTypeName_abi_cxx11_(&local_f8,(details *)(ulong)this->colornKind,bufType);
  std::operator+(&local_b8,&local_d8,&local_f8);
  std::operator+(&local_98,&local_b8,"_");
  attTypeName_abi_cxx11_(&local_118,(details *)(ulong)this->depthKind,bufType_00);
  std::operator+(&local_78,&local_98,&local_118);
  std::operator+(&local_58,&local_78,"_");
  attTypeName_abi_cxx11_(&sStack_138,(details *)(ulong)this->stencilKind,bufType_01);
  std::operator+(__return_storage_ptr__,&local_58,&sStack_138);
  std::__cxx11::string::~string((string *)&sStack_138);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string AttachmentParams::getName (const AttachmentParams& params)
{
	return (attTypeName(params.color0Kind) + "_" +
			attTypeName(params.colornKind) + "_" +
			attTypeName(params.depthKind) + "_" +
			attTypeName(params.stencilKind));
}